

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

void __thiscall HVectorBase<HighsCDouble>::clear(HVectorBase<HighsCDouble> *this)

{
  pointer pHVar1;
  int iVar2;
  pointer piVar3;
  pointer pHVar4;
  HighsInt i;
  long lVar5;
  value_type local_18;
  
  iVar2 = this->count;
  if (((long)iVar2 < 0) || ((double)this->size * 0.3 < (double)iVar2)) {
    local_18.hi = 0.0;
    local_18.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
              (&this->array,(long)this->size,&local_18);
  }
  else {
    piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar4 = (this->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar5 = 0; iVar2 != lVar5; lVar5 = lVar5 + 1) {
      pHVar1 = pHVar4 + piVar3[lVar5];
      pHVar1->hi = 0.0;
      pHVar1->lo = 0.0;
    }
  }
  this->packFlag = false;
  this->count = 0;
  this->synthetic_tick = 0.0;
  this->next = (HVectorBase<HighsCDouble> *)0x0;
  return;
}

Assistant:

void HVectorBase<Real>::clear() {
  /*
   * Clear an HVector instance
   */
  // Standard HVector to clear
  HighsInt dense_clear = count < 0 || count > size * 0.3;
  if (dense_clear) {
    // Treat the array as full if there are no indices or too many
    // indices
    array.assign(size, Real{0});
  } else {
    // Zero according to the indices of (possible) nonzeros
    for (HighsInt i = 0; i < count; i++) {
      array[index[i]] = 0;
    }
  }
  this->clearScalars();
}